

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O3

void __thiscall
SuiteDataDictionaryTests::TestgetTrailerOrderedFields_GetOrderTwice::
~TestgetTrailerOrderedFields_GetOrderTwice(TestgetTrailerOrderedFields_GetOrderTwice *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(getTrailerOrderedFields_GetOrderTwice) {
  DataDictionary dictionary;
  dictionary.preserveMessageFieldsOrder(true);

  dictionary.addTrailerField(1, true);
  dictionary.addTrailerField(2, true);
  dictionary.addTrailerField(3, true);

  message_order trailer_order = dictionary.getTrailerOrderedFields();
  //Get Order Second Time
  trailer_order = dictionary.getTrailerOrderedFields();

  FieldMap fieldMap(trailer_order);
  fieldMap.setField(3, "Field3");
  fieldMap.setField(1, "Field1");
  fieldMap.setField(2, "Field2");

  int pos1 = 0, pos2 = 0, pos3 = 0;
  int iterationCount = 0;
  for( FieldMap::iterator itr = fieldMap.begin(); itr != fieldMap.end(); itr++, iterationCount++) {
    if(iterationCount == 0) {
      pos1 = itr->getTag();
    } else if (iterationCount == 1 ) {
      pos2 = itr->getTag();
    } else if (iterationCount == 2) {
      pos3 = itr->getTag();
    }
  }

  CHECK_EQUAL(1, pos1);
  CHECK_EQUAL(2, pos2);
  CHECK_EQUAL(3, pos3);
}